

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

Kit_DsdMan_t * Kit_DsdManAlloc(int nVars,int nNodes)

{
  undefined4 uVar1;
  void *pvVar2;
  bool bVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Kit_DsdMan_t *pKVar8;
  void **ppvVar9;
  void **ppvVar10;
  Vec_Ptr_t *pVVar11;
  CloudManager *pCVar12;
  long lVar13;
  Vec_Int_t *pVVar14;
  int *piVar15;
  long lVar16;
  ulong uVar17;
  void **ppvVar18;
  int nWords;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  int iVar22;
  int iVar24;
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  int iVar29;
  undefined1 auVar28 [16];
  long lVar26;
  
  pKVar8 = (Kit_DsdMan_t *)calloc(1,0x30);
  pKVar8->nVars = nVars;
  uVar4 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar4 = 1;
  }
  pKVar8->nWords = uVar4;
  lVar21 = (long)(int)uVar4;
  lVar13 = lVar21 * 4 + 8;
  ppvVar9 = (void **)malloc(lVar13 * nVars);
  if (0 < nVars) {
    ppvVar10 = ppvVar9 + nVars;
    ppvVar18 = ppvVar9;
    uVar19 = (ulong)(uint)nVars;
    do {
      *ppvVar18 = ppvVar10;
      ppvVar18 = ppvVar18 + 1;
      ppvVar10 = (void **)((long)ppvVar10 + lVar21 * 4);
      uVar19 = uVar19 - 1;
    } while (uVar19 != 0);
  }
  pVVar11 = (Vec_Ptr_t *)malloc(0x10);
  pVVar11->nSize = nVars;
  pVVar11->nCap = nVars;
  pVVar11->pArray = ppvVar9;
  auVar7 = _DAT_0094f530;
  auVar6 = _DAT_0094e250;
  auVar5 = _DAT_0094e240;
  if (0 < nVars) {
    lVar16 = (ulong)uVar4 - 1;
    auVar23._8_4_ = (int)lVar16;
    auVar23._0_8_ = lVar16;
    auVar23._12_4_ = (int)((ulong)lVar16 >> 0x20);
    uVar19 = 0;
    auVar23 = auVar23 ^ _DAT_0094e250;
    do {
      pvVar2 = ppvVar9[uVar19];
      iVar22 = auVar23._0_4_;
      iVar24 = auVar23._4_4_;
      if (uVar19 < 5) {
        if (0 < (int)uVar4) {
          uVar1 = (&DAT_00a11210)[uVar19];
          lVar16 = 0;
          auVar25 = auVar5;
          auVar27 = auVar7;
          do {
            auVar28 = auVar25 ^ auVar6;
            if ((bool)(~(auVar28._4_4_ == iVar24 && iVar22 < auVar28._0_4_ || iVar24 < auVar28._4_4_
                        ) & 1)) {
              *(undefined4 *)((long)pvVar2 + lVar16) = uVar1;
            }
            if ((auVar28._12_4_ != auVar23._12_4_ || auVar28._8_4_ <= auVar23._8_4_) &&
                auVar28._12_4_ <= auVar23._12_4_) {
              *(undefined4 *)((long)pvVar2 + lVar16 + 4) = uVar1;
            }
            iVar29 = SUB164(auVar27 ^ auVar6,4);
            if (iVar29 <= iVar24 && (iVar29 != iVar24 || SUB164(auVar27 ^ auVar6,0) <= iVar22)) {
              *(undefined4 *)((long)pvVar2 + lVar16 + 8) = uVar1;
              *(undefined4 *)((long)pvVar2 + lVar16 + 0xc) = uVar1;
            }
            lVar26 = auVar25._8_8_;
            auVar25._0_8_ = auVar25._0_8_ + 4;
            auVar25._8_8_ = lVar26 + 4;
            lVar26 = auVar27._8_8_;
            auVar27._0_8_ = auVar27._0_8_ + 4;
            auVar27._8_8_ = lVar26 + 4;
            lVar16 = lVar16 + 0x10;
          } while ((ulong)(uVar4 + 3 >> 2) << 4 != lVar16);
        }
      }
      else if (0 < (int)uVar4) {
        uVar20 = 1 << ((char)uVar19 - 5U & 0x1f);
        uVar17 = 0;
        auVar28 = auVar5;
        do {
          bVar3 = iVar22 < SUB164(auVar28 ^ auVar6,0);
          iVar29 = SUB164(auVar28 ^ auVar6,4);
          if ((bool)(~(iVar24 < iVar29 || iVar29 == iVar24 && bVar3) & 1)) {
            *(uint *)((long)pvVar2 + uVar17 * 4) = -(uint)((uVar20 & (uint)uVar17) != 0);
          }
          if (iVar24 >= iVar29 && (iVar29 != iVar24 || !bVar3)) {
            *(uint *)((long)pvVar2 + uVar17 * 4 + 4) = -(uint)(((uint)uVar17 + 1 & uVar20) != 0);
          }
          uVar17 = uVar17 + 2;
          lVar16 = auVar28._8_8_;
          auVar28._0_8_ = auVar28._0_8_ + 2;
          auVar28._8_8_ = lVar16 + 2;
        } while ((uVar4 + 1 & 0xfffffffe) != uVar17);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != (uint)nVars);
  }
  pKVar8->vTtElems = pVVar11;
  ppvVar9 = (void **)malloc(lVar13 * nNodes);
  if (0 < nNodes) {
    ppvVar10 = ppvVar9 + nNodes;
    uVar19 = (ulong)(uint)nNodes;
    ppvVar18 = ppvVar9;
    do {
      *ppvVar18 = ppvVar10;
      ppvVar18 = ppvVar18 + 1;
      ppvVar10 = (void **)((long)ppvVar10 + lVar21 * 4);
      uVar19 = uVar19 - 1;
    } while (uVar19 != 0);
  }
  pVVar11 = (Vec_Ptr_t *)malloc(0x10);
  pVVar11->nSize = nNodes;
  pVVar11->nCap = nNodes;
  pVVar11->pArray = ppvVar9;
  pKVar8->vTtNodes = pVVar11;
  pCVar12 = Cloud_Init(0x10,0xe);
  pKVar8->dd = pCVar12;
  ppvVar9 = (void **)malloc(lVar13 * 0x1000);
  lVar13 = 0x8000;
  lVar16 = 0;
  do {
    ppvVar9[lVar16] = (void *)((long)ppvVar9 + lVar13);
    lVar16 = lVar16 + 1;
    lVar13 = lVar13 + lVar21 * 4;
  } while (lVar16 != 0x1000);
  pVVar11 = (Vec_Ptr_t *)malloc(0x10);
  pVVar11->nCap = 0x1000;
  pVVar11->nSize = 0x1000;
  pVVar11->pArray = ppvVar9;
  pKVar8->vTtBdds = pVVar11;
  pVVar14 = (Vec_Int_t *)malloc(0x10);
  pVVar14->nCap = 0x200;
  pVVar14->nSize = 0;
  piVar15 = (int *)malloc(0x800);
  pVVar14->pArray = piVar15;
  pKVar8->vNodes = pVVar14;
  return pKVar8;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates the DSD manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Kit_DsdMan_t * Kit_DsdManAlloc( int nVars, int nNodes )
{
    Kit_DsdMan_t * p;
    p = ABC_ALLOC( Kit_DsdMan_t, 1 );
    memset( p, 0, sizeof(Kit_DsdMan_t) );
    p->nVars    = nVars;
    p->nWords   = Kit_TruthWordNum( p->nVars );
    p->vTtElems = Vec_PtrAllocTruthTables( p->nVars );
    p->vTtNodes = Vec_PtrAllocSimInfo( nNodes, p->nWords );
    p->dd       = Cloud_Init( 16, 14 );
    p->vTtBdds  = Vec_PtrAllocSimInfo( (1<<12), p->nWords );
    p->vNodes   = Vec_IntAlloc( 512 );
    return p;
}